

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O2

void * __thiscall FResourceLump::CacheLump(FResourceLump *this)

{
  char *pcVar1;
  
  pcVar1 = this->Cache;
  if (pcVar1 == (char *)0x0) {
    if (this->LumpSize < 1) {
      pcVar1 = (char *)0x0;
    }
    else {
      (*this->_vptr_FResourceLump[7])(this);
      pcVar1 = this->Cache;
    }
  }
  else if ('\0' < this->RefCount) {
    this->RefCount = this->RefCount + '\x01';
  }
  return pcVar1;
}

Assistant:

void *FResourceLump::CacheLump()
{
	if (Cache != NULL)
	{
		if (RefCount > 0) RefCount++;
	}
	else if (LumpSize > 0)
	{
		FillCache();
	}
	return Cache;
}